

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLDateTime::normalize(XMLDateTime *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_1c;
  int carry;
  int temp;
  int negate;
  XMLDateTime *this_local;
  
  if ((this->fValue[7] != 0) && (this->fValue[7] != 1)) {
    iVar3 = 1;
    if (this->fValue[7] == 2) {
      iVar3 = -1;
    }
    iVar2 = this->fValue[1];
    iVar1 = modulo(iVar2,1,0xd);
    this->fValue[1] = iVar1;
    local_1c = fQuotient(iVar2,1,0xd);
    if (this->fValue[1] < 1) {
      this->fValue[1] = this->fValue[1] + 0xc;
      local_1c = local_1c + -1;
    }
    this->fValue[0] = local_1c + this->fValue[0];
    iVar2 = this->fValue[4] + iVar3 * this->fTimeZone[1];
    local_1c = fQuotient(iVar2,0x3c);
    iVar2 = mod(iVar2,0x3c,local_1c);
    this->fValue[4] = iVar2;
    if (this->fValue[4] < 0) {
      this->fValue[4] = this->fValue[4] + 0x3c;
      local_1c = local_1c + -1;
    }
    iVar3 = this->fValue[3] + iVar3 * this->fTimeZone[0] + local_1c;
    local_1c = fQuotient(iVar3,0x18);
    iVar3 = mod(iVar3,0x18,local_1c);
    this->fValue[3] = iVar3;
    if (this->fValue[3] < 0) {
      this->fValue[3] = this->fValue[3] + 0x18;
      local_1c = local_1c + -1;
    }
    this->fValue[2] = local_1c + this->fValue[2];
    do {
      iVar3 = maxDayInMonthFor(this->fValue[0],this->fValue[1]);
      if (this->fValue[2] < 1) {
        iVar3 = maxDayInMonthFor(this->fValue[0],this->fValue[1] + -1);
        this->fValue[2] = iVar3 + this->fValue[2];
        local_1c = -1;
      }
      else {
        if (this->fValue[2] <= iVar3) {
          this->fValue[7] = 1;
          return;
        }
        this->fValue[2] = this->fValue[2] - iVar3;
        local_1c = 1;
      }
      local_1c = this->fValue[1] + local_1c;
      iVar3 = modulo(local_1c,1,0xd);
      this->fValue[1] = iVar3;
      if (this->fValue[1] < 1) {
        this->fValue[1] = this->fValue[1] + 0xc;
        this->fValue[0] = this->fValue[0] + -1;
      }
      iVar3 = fQuotient(local_1c,1,0xd);
      this->fValue[0] = iVar3 + this->fValue[0];
    } while( true );
  }
  return;
}

Assistant:

void XMLDateTime::normalize()
{

    if ((fValue[utc] == UTC_UNKNOWN) ||
        (fValue[utc] == UTC_STD)      )
        return;

    int negate = (fValue[utc] == UTC_POS)? -1: 1;
    int temp;
    int carry;


    // we normalize a duration so could have 200M...
    //update months (may be modified additionaly below)
    temp = fValue[Month];
    fValue[Month] = modulo(temp, 1, 13);
    carry = fQuotient(temp, 1, 13);
    if (fValue[Month] <= 0) {
        fValue[Month]+= 12;
        carry--;
    }

    //add years (may be modified additionaly below)
    fValue[CentYear] += carry;

    // add mins
    temp = fValue[Minute] + negate * fTimeZone[mm];
    carry = fQuotient(temp, 60);
    fValue[Minute] = mod(temp, 60, carry);
    if (fValue[Minute] < 0) {
        fValue[Minute] += 60;
        carry--;
    }

    //add hours
    temp = fValue[Hour] + negate * fTimeZone[hh] + carry;
    carry = fQuotient(temp, 24);
    fValue[Hour] = mod(temp, 24, carry);
    if (fValue[Hour] < 0) {
        fValue[Hour] += 24;
        carry--;
    }

    fValue[Day] += carry;

    while (1)
    {
        temp = maxDayInMonthFor(fValue[CentYear], fValue[Month]);
        if (fValue[Day] < 1)
        {
            fValue[Day] += maxDayInMonthFor(fValue[CentYear], fValue[Month] - 1);
            carry = -1;
        }
        else if ( fValue[Day] > temp )
        {
            fValue[Day] -= temp;
            carry = 1;
        }
        else
        {
            break;
        }

        temp = fValue[Month] + carry;
        fValue[Month] = modulo(temp, 1, 13);
        if (fValue[Month] <=0) {
            fValue[Month]+= 12;
            fValue[CentYear]--;
        }
        fValue[CentYear] += fQuotient(temp, 1, 13);
    }

    // set to normalized
    fValue[utc] = UTC_STD;

    return;
}